

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O2

int __thiscall rapic::client::connect(client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  pointer pbVar1;
  connection_state cVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  time_t tVar6;
  system_error *this_00;
  error_category *peVar7;
  undefined4 in_register_0000000c;
  code *pcVar8;
  undefined4 in_register_00000034;
  undefined *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filter;
  pointer pbVar10;
  addrinfo *addr;
  addrinfo local_58;
  
  if (this->state_ == disconnected) {
    std::__cxx11::string::operator=((string *)this,(string *)CONCAT44(in_register_00000034,__fd));
    std::__cxx11::string::operator=((string *)&this->service_,(string *)__addr);
    LOCK();
    (this->wcount_).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->rcount_).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    local_58.ai_flags = 0;
    local_58.ai_family = 0;
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 0;
    iVar3 = getaddrinfo((this->address_)._M_dataplus._M_p,(this->service_)._M_dataplus._M_p,
                        &local_58,(addrinfo **)&addr);
    if ((iVar3 == 0) && (addr != (addrinfo *)0x0)) {
      iVar3 = socket(addr->ai_family,addr->ai_socktype,addr->ai_protocol);
      this->socket_ = iVar3;
      if (iVar3 == -1) {
        freeaddrinfo((addrinfo *)addr);
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        peVar7 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_00,iVar3,peVar7,"rapic: socket creation failed");
      }
      else {
        uVar4 = fcntl(iVar3,3);
        if (uVar4 == 0xffffffff) {
          disconnect(this);
          freeaddrinfo((addrinfo *)addr);
          this_00 = (system_error *)__cxa_allocate_exception(0x20);
          piVar5 = __errno_location();
          iVar3 = *piVar5;
          peVar7 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(this_00,iVar3,peVar7,"rapic: failed to read socket flags")
          ;
        }
        else {
          iVar3 = fcntl(this->socket_,4,(ulong)(uVar4 | 0x800));
          if (iVar3 == -1) {
            disconnect(this);
            freeaddrinfo((addrinfo *)addr);
            this_00 = (system_error *)__cxa_allocate_exception(0x20);
            piVar5 = __errno_location();
            iVar3 = *piVar5;
            peVar7 = (error_category *)std::_V2::system_category();
            std::system_error::system_error
                      (this_00,iVar3,peVar7,"rapic: failed to set socket flags");
          }
          else {
            iVar3 = ::connect(this->socket_,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
            if (-1 < iVar3) {
              cVar2 = established;
LAB_00108470:
              this->state_ = cVar2;
              freeaddrinfo((addrinfo *)addr);
              tVar6 = time((time_t *)0x0);
              this->last_activity_ = tVar6;
              iVar3 = std::__cxx11::string::_M_assign((string *)&this->wbuffer_);
              pbVar1 = (this->filters_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar10 = (this->filters_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
                  pbVar10 = pbVar10 + 1) {
                iVar3 = std::__cxx11::string::append((string *)&this->wbuffer_);
              }
              return iVar3;
            }
            piVar5 = __errno_location();
            if (*piVar5 == 0x73) {
              cVar2 = in_progress;
              goto LAB_00108470;
            }
            disconnect(this);
            freeaddrinfo((addrinfo *)addr);
            this_00 = (system_error *)__cxa_allocate_exception(0x20);
            iVar3 = *piVar5;
            peVar7 = (error_category *)std::_V2::system_category();
            std::system_error::system_error
                      (this_00,iVar3,peVar7,"rapic: failed to establish connection");
          }
        }
      }
      puVar9 = &std::system_error::typeinfo;
      pcVar8 = std::system_error::~system_error;
      goto LAB_00108613;
    }
    this_00 = (system_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              ((runtime_error *)this_00,"rapic: unable to resolve server address");
  }
  else {
    this_00 = (system_error *)
              __cxa_allocate_exception
                        (0x10,(string *)CONCAT44(in_register_00000034,__fd),__addr,
                         CONCAT44(in_register_0000000c,__len));
    std::runtime_error::runtime_error
              ((runtime_error *)this_00,"rapic: connect called while already connected");
  }
  puVar9 = &std::runtime_error::typeinfo;
  pcVar8 = std::runtime_error::~runtime_error;
LAB_00108613:
  __cxa_throw(this_00,puVar9,pcVar8);
}

Assistant:

auto client::connect(std::string address, std::string service) -> void
{
  if (state_ != rapic::connection_state::disconnected)
    throw std::runtime_error{"rapic: connect called while already connected"};

  // store connection details
  address_ = std::move(address);
  service_ = std::move(service);

  // reset connection state
  wcount_ = 0;
  rcount_ = 0;

  // lookupt the host
  addrinfo hints, *addr;
  memset(&hints, 0, sizeof(hints));
  hints.ai_flags = 0;
  hints.ai_family = AF_UNSPEC;
  hints.ai_socktype = SOCK_STREAM;
  int ret = getaddrinfo(address_.c_str(), service_.c_str(), &hints, &addr);
  if (ret != 0 || addr == nullptr)
    throw std::runtime_error{"rapic: unable to resolve server address"};

  // TODO - loop through all addresses?
  if (addr->ai_next)
  {

  }

  // create the socket
  socket_ = socket(addr->ai_family, addr->ai_socktype, addr->ai_protocol);
  if (socket_ == -1)
  {
    freeaddrinfo(addr);
    throw std::system_error{errno, std::system_category(), "rapic: socket creation failed"};
  }

  // set non-blocking I/O
  int flags = fcntl(socket_, F_GETFL);
  if (flags == -1)
  {
    disconnect();
    freeaddrinfo(addr);
    throw std::system_error{errno, std::system_category(), "rapic: failed to read socket flags"};
  }
  if (fcntl(socket_, F_SETFL, flags | O_NONBLOCK) == -1)
  {
    disconnect();
    freeaddrinfo(addr);
    throw std::system_error{errno, std::system_category(), "rapic: failed to set socket flags"};
  }

  // connect to the remote host
  ret = ::connect(socket_, addr->ai_addr, addr->ai_addrlen);
  if (ret < 0)
  {
    if (errno != EINPROGRESS)
    {
      disconnect();
      freeaddrinfo(addr);
      throw std::system_error{errno, std::system_category(), "rapic: failed to establish connection"};
    }
    state_ = rapic::connection_state::in_progress;
  }
  else
    state_ = rapic::connection_state::established;

  // clean up the address list allocated by getaddrinfo
  freeaddrinfo(addr);

  // set the last activity to now so we don't immediately timeout
  last_activity_ = time(NULL);

  // queue up our permanent connection and filter messages for output as soon as we connect
  /* note: since the only things we ever send is the initial connection, the filters and occasional keepalive
   *       messages, we don't bother with complex write buffering.  the buffer is a simple string which will
   *       be empty except for keepalives after the initial connection negotiation. */
  wbuffer_.assign(msg_connect);
  for (auto& filter : filters_)
    wbuffer_.append(filter);
}